

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

ExceptionOr<kj::Maybe<kj::HttpHeaders::Response>_> * __thiscall
kj::_::ExceptionOr<kj::Maybe<kj::HttpHeaders::Response>_>::operator=
          (ExceptionOr<kj::Maybe<kj::HttpHeaders::Response>_> *this,
          ExceptionOr<kj::Maybe<kj::HttpHeaders::Response>_> *param_1)

{
  bool bVar1;
  undefined8 uVar2;
  
  ExceptionOrValue::operator=(&this->super_ExceptionOrValue,&param_1->super_ExceptionOrValue);
  if (param_1 != this) {
    if ((this->value).ptr.isSet == true) {
      (this->value).ptr.isSet = false;
    }
    if ((param_1->value).ptr.isSet == true) {
      bVar1 = (param_1->value).ptr.field_1.value.ptr.isSet;
      (this->value).ptr.field_1.value.ptr.isSet = bVar1;
      if (bVar1 == true) {
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x18) =
             *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 0x18);
        uVar2 = *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 0x10);
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 8) =
             *(undefined8 *)((long)&(param_1->value).ptr.field_1 + 8);
        *(undefined8 *)((long)&(this->value).ptr.field_1 + 0x10) = uVar2;
      }
      (this->value).ptr.isSet = true;
    }
  }
  return this;
}

Assistant:

ExceptionOr& operator=(ExceptionOr&&) = default;